

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O3

int Psr_ManReadList(Psr_Man_t *p,Vec_Int_t *vOrder,int Type)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  byte *pStr;
  
  (p->vTemp).nSize = 0;
LAB_0031b595:
  pStr = (byte *)p->pCur;
LAB_0031b599:
  bVar1 = *pStr;
  if (bVar1 < 0x20) {
    if ((bVar1 != 9) && (bVar1 != 0xd)) goto LAB_0031b5da;
LAB_0031b5d1:
    pStr = pStr + 1;
  }
  else {
    if (bVar1 == 0x20) goto LAB_0031b5d1;
    if (bVar1 != 0x5c) {
      if (bVar1 != 0x23) goto LAB_0031b5e6;
      do {
        pStr = pStr + 1;
        p->pCur = (char *)pStr;
      } while (*pStr != 10);
LAB_0031b651:
      iVar2 = 0;
      if ((p->vTemp).nSize == 0) {
        if (p->ErrorStr[0] != '\0') {
          __assert_fail("!p->ErrorStr[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacPrs.h"
                        ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
        }
        builtin_strncpy(p->ErrorStr,"Signal list is empty.",0x16);
        iVar2 = 1;
      }
      return iVar2;
    }
    pbVar3 = pStr + 1;
    do {
      p->pCur = (char *)pbVar3;
      pStr = pbVar3 + 1;
      bVar1 = *pbVar3;
      pbVar3 = pStr;
    } while (bVar1 != 10);
  }
  p->pCur = (char *)pStr;
  goto LAB_0031b599;
LAB_0031b5da:
  if (bVar1 == 10) goto LAB_0031b651;
LAB_0031b5e6:
  lVar4 = 0;
  pbVar3 = pStr;
  while( true ) {
    pbVar5 = pbVar3 + 1;
    if (((bVar1 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       (bVar1 == 0x5c)) break;
    p->pCur = (char *)pbVar5;
    bVar1 = *pbVar5;
    lVar4 = lVar4 + -1;
    pbVar3 = pbVar5;
  }
  if ((lVar4 == 0) ||
     (iVar2 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pStr,(char *)pbVar3,(int *)0x0), iVar2 == 0))
  goto LAB_0031b651;
  Vec_IntPush(&p->vTemp,iVar2);
  Vec_IntPush(vOrder,Type + iVar2 * 4);
  goto LAB_0031b595;
}

Assistant:

static inline int Psr_ManReadList( Psr_Man_t * p, Vec_Int_t * vOrder, int Type )
{
    int iToken;
    Vec_IntClear( &p->vTemp );
    while ( (iToken = Psr_ManReadName(p)) )
    {
        Vec_IntPush( &p->vTemp, iToken );
        Vec_IntPush( vOrder, Abc_Var2Lit2(iToken, Type) );
    }
    if ( Vec_IntSize(&p->vTemp) == 0 )                return Psr_ManErrorSet(p, "Signal list is empty.", 1);
    return 0;
}